

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O2

int update_mvs_and_sad(uint this_sad,FULLPEL_MV *mv,MV_COST_PARAMS *mv_cost_params,uint *best_sad,
                      uint *raw_best_sad,FULLPEL_MV *best_mv,FULLPEL_MV *second_best_mv)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  
  uVar1 = *best_sad;
  iVar3 = 0;
  if (this_sad < uVar1) {
    iVar2 = mvsad_err_cost_(mv,mv_cost_params);
    if (iVar2 + this_sad < uVar1) {
      if (raw_best_sad != (uint *)0x0) {
        *raw_best_sad = this_sad;
      }
      *best_sad = iVar2 + this_sad;
      if (second_best_mv != (FULLPEL_MV *)0x0) {
        *second_best_mv = *best_mv;
      }
      *best_mv = *mv;
      iVar3 = 1;
    }
  }
  return iVar3;
}

Assistant:

static inline int update_mvs_and_sad(const unsigned int this_sad,
                                     const FULLPEL_MV *mv,
                                     const MV_COST_PARAMS *mv_cost_params,
                                     unsigned int *best_sad,
                                     unsigned int *raw_best_sad,
                                     FULLPEL_MV *best_mv,
                                     FULLPEL_MV *second_best_mv) {
  if (this_sad >= *best_sad) return 0;

  // Add the motion vector cost.
  const unsigned int sad = this_sad + mvsad_err_cost_(mv, mv_cost_params);
  if (sad < *best_sad) {
    if (raw_best_sad) *raw_best_sad = this_sad;
    *best_sad = sad;
    if (second_best_mv) *second_best_mv = *best_mv;
    *best_mv = *mv;
    return 1;
  }
  return 0;
}